

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O3

void __thiscall
Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile
          (TiledRgbaInputFile *this,IStream *is,string *layerName,int numThreads)

{
  char *name;
  ContextInitializer *ctxt;
  ContextInitializer local_a0;
  
  name = IStream::fileName(is);
  local_a0._prov_stream = (IStream *)0x0;
  local_a0._initializer.size = 0x68;
  local_a0._initializer.error_handler_fn = (exr_error_handler_cb_t)0x0;
  local_a0._initializer.alloc_fn = (exr_memory_allocation_func_t)0x0;
  local_a0._initializer.free_fn = (exr_memory_free_func_t)0x0;
  local_a0._initializer.user_data = (void *)0x0;
  local_a0._initializer.read_fn = (exr_read_func_ptr_t)0x0;
  local_a0._initializer.size_fn = (exr_query_size_func_ptr_t)0x0;
  local_a0._initializer.write_fn = (exr_write_func_ptr_t)0x0;
  local_a0._initializer.destroy_fn = (exr_destroy_stream_func_ptr_t)0x0;
  local_a0._initializer.max_image_width = 0;
  local_a0._initializer.max_image_height = 0;
  local_a0._initializer.max_tile_width = 0;
  local_a0._initializer.max_tile_height = 0;
  local_a0._initializer.zip_level = -2;
  local_a0._initializer.dwa_quality = -1.0;
  local_a0._initializer.flags = 2;
  local_a0._initializer.pad[0] = '\0';
  local_a0._initializer.pad[1] = '\0';
  local_a0._initializer.pad[2] = '\0';
  local_a0._initializer.pad[3] = '\0';
  local_a0._ctxt_type = TEMP;
  local_a0._108_4_ = 0;
  ctxt = ContextInitializer::setInputStream(&local_a0,is);
  TiledRgbaInputFile(this,name,ctxt,layerName,numThreads);
  return;
}

Assistant:

TiledRgbaInputFile::TiledRgbaInputFile (
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is,
    const string&                            layerName,
    int                                      numThreads)
    : TiledRgbaInputFile (
        is.fileName (),
        ContextInitializer ()
        .silentHeaderParse (true)
        .strictHeaderValidation (false)
        .setInputStream (&is),
        layerName,
        numThreads)
{
}